

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin1.c
# Opt level: O3

void Saig_ManCexMinCollectFrameTerms_rec(Aig_Man_t *pAig,Aig_Obj_t *pObj,Vec_Int_t *vFrameCisOne)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Aig_Obj_t **ppAVar4;
  
  iVar1 = pAig->nTravIds;
  if (pObj->TravId != iVar1) {
    do {
      pObj->TravId = iVar1;
      uVar3 = (uint)*(undefined8 *)&pObj->field_0x18;
      uVar2 = uVar3 & 7;
      if (uVar2 == 3) {
        ppAVar4 = &pObj->pFanin0;
      }
      else {
        if ((uVar3 & 7) - 7 < 0xfffffffe) {
          if (uVar2 != 2) {
            return;
          }
          Vec_IntPush(vFrameCisOne,pObj->Id);
          return;
        }
        Saig_ManCexMinCollectFrameTerms_rec
                  (pAig,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vFrameCisOne);
        ppAVar4 = &pObj->pFanin1;
        iVar1 = pAig->nTravIds;
      }
      pObj = (Aig_Obj_t *)((ulong)*ppAVar4 & 0xfffffffffffffffe);
    } while (pObj->TravId != iVar1);
  }
  return;
}

Assistant:

void Saig_ManCexMinCollectFrameTerms_rec( Aig_Man_t * pAig, Aig_Obj_t * pObj, Vec_Int_t * vFrameCisOne )
{
    if ( Aig_ObjIsTravIdCurrent(pAig, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(pAig, pObj);
    if ( Aig_ObjIsCo(pObj) )
        Saig_ManCexMinCollectFrameTerms_rec( pAig, Aig_ObjFanin0(pObj), vFrameCisOne );
    else if ( Aig_ObjIsNode(pObj) )
    {
        Saig_ManCexMinCollectFrameTerms_rec( pAig, Aig_ObjFanin0(pObj), vFrameCisOne );
        Saig_ManCexMinCollectFrameTerms_rec( pAig, Aig_ObjFanin1(pObj), vFrameCisOne );
    }
    else if ( Aig_ObjIsCi(pObj) )
        Vec_IntPush( vFrameCisOne, Aig_ObjId(pObj) );
}